

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psftp.c
# Opt level: O3

void do_sftp_cleanup(void)

{
  char ch;
  char local_1;
  
  if (backend != (Backend *)0x0) {
    (*backend->vt->special)(backend,SS_EOF,0);
    sent_eof = 1;
    sftp_recvdata(&local_1,1);
    (*backend->vt->free)(backend);
    sftp_cleanup_request();
    backend = (Backend *)0x0;
  }
  if (pwd != (char *)0x0) {
    safefree(pwd);
    pwd = (char *)0x0;
  }
  if (homedir != (char *)0x0) {
    safefree(homedir);
    homedir = (char *)0x0;
  }
  return;
}

Assistant:

static void do_sftp_cleanup(void)
{
    char ch;
    if (backend) {
        backend_special(backend, SS_EOF, 0);
        sent_eof = true;
        sftp_recvdata(&ch, 1);
        backend_free(backend);
        sftp_cleanup_request();
        backend = NULL;
    }
    if (pwd) {
        sfree(pwd);
        pwd = NULL;
    }
    if (homedir) {
        sfree(homedir);
        homedir = NULL;
    }
}